

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O3

String * __thiscall
glcts::LayoutBindingProgram::getErrorLog_abi_cxx11_
          (String *__return_storage_ptr__,LayoutBindingProgram *this,bool dumpShaders)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  ShaderProgram *pSVar3;
  Shader *pSVar4;
  int iVar5;
  eStageType eVar6;
  ostream *poVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  char *pcVar8;
  undefined8 uVar9;
  Shader *pSVar10;
  String msg;
  StringStream errLog;
  String local_1f0;
  String local_1d0;
  Shader *local_1b0;
  undefined1 local_1a8 [112];
  undefined **local_138;
  undefined8 local_60;
  undefined2 local_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  std::ios_base::ios_base((ios_base *)&local_138);
  local_138 = (undefined **)glUniformMatrix3x2fv;
  local_60 = 0;
  local_58 = 0;
  local_50 = 0;
  uStack_48 = 0;
  local_40 = 0;
  uStack_38 = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  local_1a8._0_8_ = &PTR__StringStream_020fda68;
  local_138 = &PTR__StringStream_020fda90;
  iVar5 = (*this->_vptr_LayoutBindingProgram[2])(this);
  pSVar3 = this->m_program;
  if (iVar5 == 2) {
    pSVar4 = *pSVar3->m_shaders[5].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (((pSVar4->m_info).compileOk != true) ||
       ((byte)((pSVar3->m_program).m_info.linkOk ^ 1U | dumpShaders) == 1)) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"### dump of ",0xc);
      paVar1 = &local_1f0.field_2;
      local_1f0.field_2._M_allocated_capacity._0_5_ = 0x75706d6f43;
      local_1f0.field_2._M_local_buf[5] = 't';
      local_1f0.field_2._M_allocated_capacity._6_2_ = 0x5365;
      local_1f0.field_2._8_4_ = 0x65646168;
      local_1f0.field_2._M_local_buf[0xc] = 'r';
      local_1f0._M_string_length = 0xd;
      local_1f0.field_2._M_local_buf[0xd] = '\0';
      local_1f0._M_dataplus._M_p = (pointer)paVar1;
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,paVar1->_M_local_buf,0xd);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"###\n",4);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != paVar1) {
        operator_delete(local_1f0._M_dataplus._M_p,
                        CONCAT26(local_1f0.field_2._M_allocated_capacity._6_2_,
                                 CONCAT15(local_1f0.field_2._M_local_buf[5],
                                          local_1f0.field_2._M_allocated_capacity._0_5_)) + 1);
      }
      pcVar8 = "Compute shader compile failed while testing ";
      if (dumpShaders) {
        pcVar8 = "Compute shader should not have compiled";
      }
      local_1f0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1f0,pcVar8,pcVar8 + (ulong)!dumpShaders * 5 + 0x27);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,local_1f0._M_dataplus._M_p,local_1f0._M_string_length
                         );
      paVar2 = &local_1d0.field_2;
      local_1d0.field_2._M_allocated_capacity._0_5_ = 0x75706d6f43;
      local_1d0.field_2._M_allocated_capacity._5_3_ = 0x536574;
      local_1d0.field_2._8_5_ = 0x7265646168;
      local_1d0._M_string_length = 0xd;
      local_1d0.field_2._M_local_buf[0xd] = '\0';
      local_1d0._M_dataplus._M_p = (pointer)paVar2;
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,paVar2->_M_local_buf,0xd);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,": ",2);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,(pSVar4->m_info).infoLog._M_dataplus._M_p,
                          (pSVar4->m_info).infoLog._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != paVar2) {
        operator_delete(local_1d0._M_dataplus._M_p,
                        CONCAT35(local_1d0.field_2._M_allocated_capacity._5_3_,
                                 local_1d0.field_2._M_allocated_capacity._0_5_) + 1);
      }
      iVar5 = (*this->m_contextSupplier->_vptr_IProgramContextSupplier[5])
                        (this->m_contextSupplier,2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,*(char **)CONCAT44(extraout_var,iVar5),
                 ((undefined8 *)CONCAT44(extraout_var,iVar5))[1]);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != paVar1) {
        operator_delete(local_1f0._M_dataplus._M_p,
                        CONCAT26(local_1f0.field_2._M_allocated_capacity._6_2_,
                                 CONCAT15(local_1f0.field_2._M_local_buf[5],
                                          local_1f0.field_2._M_allocated_capacity._0_5_)) + 1);
      }
    }
  }
  else {
    pSVar4 = *pSVar3->m_shaders[1].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pSVar10 = *pSVar3->m_shaders[0].
               super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    if (((pSVar4->m_info).compileOk != true) ||
       ((byte)((pSVar3->m_program).m_info.linkOk ^ 1U | dumpShaders) == 1)) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"### dump of ",0xc);
      paVar1 = &local_1f0.field_2;
      local_1f0.field_2._M_allocated_capacity._0_5_ = 0x6d67617246;
      local_1f0.field_2._M_local_buf[5] = 'e';
      local_1f0.field_2._M_allocated_capacity._6_2_ = 0x746e;
      local_1f0.field_2._8_4_ = 0x64616853;
      local_1f0.field_2._M_local_buf[0xc] = 'e';
      local_1f0.field_2._M_local_buf[0xd] = 'r';
      local_1f0._M_string_length = 0xe;
      local_1f0.field_2._M_local_buf[0xe] = '\0';
      local_1f0._M_dataplus._M_p = (pointer)paVar1;
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,paVar1->_M_local_buf,0xe);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"###\n",4);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != paVar1) {
        operator_delete(local_1f0._M_dataplus._M_p,
                        CONCAT26(local_1f0.field_2._M_allocated_capacity._6_2_,
                                 CONCAT15(local_1f0.field_2._M_local_buf[5],
                                          local_1f0.field_2._M_allocated_capacity._0_5_)) + 1);
      }
      pcVar8 = "Vertex shader compile failed while testing ";
      if (dumpShaders) {
        pcVar8 = "Fragment shader should not have compiled";
      }
      local_1f0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1f0,pcVar8,pcVar8 + (ulong)!dumpShaders * 3 + 0x28);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"Fragment shader compile failed while testing ",0x2d);
      local_1b0 = pSVar10;
      eVar6 = (*this->_vptr_LayoutBindingProgram[2])(this);
      stageToName_abi_cxx11_(&local_1d0,this,eVar6);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,local_1d0._M_dataplus._M_p,local_1d0._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,": ",2);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,(pSVar4->m_info).infoLog._M_dataplus._M_p,
                          (pSVar4->m_info).infoLog._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p,
                        CONCAT35(local_1d0.field_2._M_allocated_capacity._5_3_,
                                 local_1d0.field_2._M_allocated_capacity._0_5_) + 1);
      }
      iVar5 = (*this->m_contextSupplier->_vptr_IProgramContextSupplier[5])
                        (this->m_contextSupplier,1);
      pSVar10 = local_1b0;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,*(char **)CONCAT44(extraout_var_00,iVar5),
                 ((undefined8 *)CONCAT44(extraout_var_00,iVar5))[1]);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != paVar1) {
        operator_delete(local_1f0._M_dataplus._M_p,
                        CONCAT26(local_1f0.field_2._M_allocated_capacity._6_2_,
                                 CONCAT15(local_1f0.field_2._M_local_buf[5],
                                          local_1f0.field_2._M_allocated_capacity._0_5_)) + 1);
      }
    }
    if (((pSVar10->m_info).compileOk != true) ||
       ((byte)((this->m_program->m_program).m_info.linkOk ^ 1U | dumpShaders) == 1)) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"### dump of ",0xc);
      paVar1 = &local_1f0.field_2;
      local_1f0.field_2._M_allocated_capacity._0_5_ = 0x6574726556;
      local_1f0.field_2._M_local_buf[5] = 'x';
      local_1f0.field_2._M_allocated_capacity._6_2_ = 0x6853;
      local_1f0.field_2._8_4_ = 0x72656461;
      local_1f0._M_string_length = 0xc;
      local_1f0.field_2._M_local_buf[0xc] = '\0';
      local_1f0._M_dataplus._M_p = (pointer)paVar1;
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,paVar1->_M_local_buf,0xc);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"###\n",4);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != paVar1) {
        operator_delete(local_1f0._M_dataplus._M_p,
                        CONCAT26(local_1f0.field_2._M_allocated_capacity._6_2_,
                                 CONCAT15(local_1f0.field_2._M_local_buf[5],
                                          local_1f0.field_2._M_allocated_capacity._0_5_)) + 1);
      }
      pcVar8 = "Vertex shader compile failed while testing ";
      if (dumpShaders) {
        pcVar8 = "Vertex shader should not have compiled";
      }
      local_1f0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1f0,pcVar8,pcVar8 + (ulong)!dumpShaders * 5 + 0x26);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,local_1f0._M_dataplus._M_p,local_1f0._M_string_length
                         );
      eVar6 = (*this->_vptr_LayoutBindingProgram[2])(this);
      stageToName_abi_cxx11_(&local_1d0,this,eVar6);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,": ",2);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,(pSVar10->m_info).infoLog._M_dataplus._M_p,
                          (pSVar10->m_info).infoLog._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p,
                        CONCAT35(local_1d0.field_2._M_allocated_capacity._5_3_,
                                 local_1d0.field_2._M_allocated_capacity._0_5_) + 1);
      }
      iVar5 = (*this->m_contextSupplier->_vptr_IProgramContextSupplier[5])
                        (this->m_contextSupplier,0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,*(char **)CONCAT44(extraout_var_01,iVar5),
                 ((undefined8 *)CONCAT44(extraout_var_01,iVar5))[1]);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != paVar1) {
        operator_delete(local_1f0._M_dataplus._M_p,
                        CONCAT26(local_1f0.field_2._M_allocated_capacity._6_2_,
                                 CONCAT15(local_1f0.field_2._M_local_buf[5],
                                          local_1f0.field_2._M_allocated_capacity._0_5_)) + 1);
      }
    }
  }
  if ((this->m_program->m_program).m_info.linkOk == false) {
    (*this->_vptr_LayoutBindingProgram[2])(this);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Linking failed while testing ",0x1d);
    eVar6 = (*this->_vptr_LayoutBindingProgram[2])(this);
    stageToName_abi_cxx11_(&local_1f0,this,eVar6);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,": ",2);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,(this->m_program->m_program).m_info.infoLog._M_dataplus._M_p,
                        (this->m_program->m_program).m_info.infoLog._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
    paVar1 = &local_1f0.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != paVar1) {
      operator_delete(local_1f0._M_dataplus._M_p,
                      CONCAT26(local_1f0.field_2._M_allocated_capacity._6_2_,
                               CONCAT15(local_1f0.field_2._M_local_buf[5],
                                        local_1f0.field_2._M_allocated_capacity._0_5_)) + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"### other stages ###\n",0x15);
    iVar5 = (*this->_vptr_LayoutBindingProgram[2])(this);
    if (iVar5 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"### dump of ",0xc);
      local_1f0.field_2._M_allocated_capacity._0_5_ = 0x6d67617246;
      local_1f0.field_2._M_local_buf[5] = 'e';
      local_1f0.field_2._M_allocated_capacity._6_2_ = 0x746e;
      local_1f0.field_2._8_4_ = 0x64616853;
      local_1f0.field_2._M_local_buf[0xc] = 'e';
      local_1f0.field_2._M_local_buf[0xd] = 'r';
      local_1f0._M_string_length = 0xe;
      local_1f0.field_2._M_local_buf[0xe] = '\0';
      local_1f0._M_dataplus._M_p = (pointer)paVar1;
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,paVar1->_M_local_buf,0xe);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"###\n",4);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != paVar1) {
        operator_delete(local_1f0._M_dataplus._M_p,
                        CONCAT26(local_1f0.field_2._M_allocated_capacity._6_2_,
                                 CONCAT15(local_1f0.field_2._M_local_buf[5],
                                          local_1f0.field_2._M_allocated_capacity._0_5_)) + 1);
      }
      local_1f0.field_2._M_allocated_capacity._0_5_ = 0x6d67617246;
      local_1f0.field_2._M_local_buf[5] = 'e';
      local_1f0.field_2._M_allocated_capacity._6_2_ = 0x746e;
      local_1f0.field_2._8_4_ = 0x64616853;
      local_1f0.field_2._M_local_buf[0xc] = 'e';
      local_1f0.field_2._M_local_buf[0xd] = 'r';
      local_1f0._M_string_length = 0xe;
      local_1f0.field_2._M_local_buf[0xe] = '\0';
      local_1f0._M_dataplus._M_p = (pointer)paVar1;
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,paVar1->_M_local_buf,0xe);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != paVar1) {
        operator_delete(local_1f0._M_dataplus._M_p,
                        CONCAT26(local_1f0.field_2._M_allocated_capacity._6_2_,
                                 CONCAT15(local_1f0.field_2._M_local_buf[5],
                                          local_1f0.field_2._M_allocated_capacity._0_5_)) + 1);
      }
      uVar9 = 1;
    }
    else if (iVar5 == 1) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"### dump of ",0xc);
      local_1f0.field_2._M_allocated_capacity._0_5_ = 0x6574726556;
      local_1f0.field_2._M_local_buf[5] = 'x';
      local_1f0.field_2._M_allocated_capacity._6_2_ = 0x6853;
      local_1f0.field_2._8_4_ = 0x72656461;
      local_1f0._M_string_length = 0xc;
      local_1f0.field_2._M_local_buf[0xc] = '\0';
      local_1f0._M_dataplus._M_p = (pointer)paVar1;
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,paVar1->_M_local_buf,0xc);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"###\n",4);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != paVar1) {
        operator_delete(local_1f0._M_dataplus._M_p,
                        CONCAT26(local_1f0.field_2._M_allocated_capacity._6_2_,
                                 CONCAT15(local_1f0.field_2._M_local_buf[5],
                                          local_1f0.field_2._M_allocated_capacity._0_5_)) + 1);
      }
      uVar9 = 0;
    }
    else {
      if (iVar5 != 2) goto LAB_00bd7085;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"### dump of ",0xc);
      local_1f0.field_2._M_allocated_capacity._0_5_ = 0x75706d6f43;
      local_1f0.field_2._M_local_buf[5] = 't';
      local_1f0.field_2._M_allocated_capacity._6_2_ = 0x5365;
      local_1f0.field_2._8_4_ = 0x65646168;
      local_1f0.field_2._M_local_buf[0xc] = 'r';
      local_1f0._M_string_length = 0xd;
      local_1f0.field_2._M_local_buf[0xd] = '\0';
      local_1f0._M_dataplus._M_p = (pointer)paVar1;
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,paVar1->_M_local_buf,0xd);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"###\n",4);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != paVar1) {
        operator_delete(local_1f0._M_dataplus._M_p,
                        CONCAT26(local_1f0.field_2._M_allocated_capacity._6_2_,
                                 CONCAT15(local_1f0.field_2._M_local_buf[5],
                                          local_1f0.field_2._M_allocated_capacity._0_5_)) + 1);
      }
      local_1f0.field_2._M_allocated_capacity._0_5_ = 0x75706d6f43;
      local_1f0.field_2._M_local_buf[5] = 't';
      local_1f0.field_2._M_allocated_capacity._6_2_ = 0x5365;
      local_1f0.field_2._8_4_ = 0x65646168;
      local_1f0.field_2._M_local_buf[0xc] = 'r';
      local_1f0._M_string_length = 0xd;
      local_1f0.field_2._M_local_buf[0xd] = '\0';
      local_1f0._M_dataplus._M_p = (pointer)paVar1;
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,paVar1->_M_local_buf,0xd);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != paVar1) {
        operator_delete(local_1f0._M_dataplus._M_p,
                        CONCAT26(local_1f0.field_2._M_allocated_capacity._6_2_,
                                 CONCAT15(local_1f0.field_2._M_local_buf[5],
                                          local_1f0.field_2._M_allocated_capacity._0_5_)) + 1);
      }
      uVar9 = 2;
    }
    iVar5 = (*this->m_contextSupplier->_vptr_IProgramContextSupplier[5])
                      (this->m_contextSupplier,uVar9);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,*(char **)CONCAT44(extraout_var_02,iVar5),
               ((undefined8 *)CONCAT44(extraout_var_02,iVar5))[1]);
  }
LAB_00bd7085:
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)&local_138);
  return __return_storage_ptr__;
}

Assistant:

String getErrorLog(bool dumpShaders = false)
	{
		StringStream errLog;

		if (getStage() != ComputeShader)
		{
			const glu::ShaderInfo& fragmentShaderInfo = m_program->getShaderInfo(glu::SHADERTYPE_FRAGMENT);
			const glu::ShaderInfo& vertexShaderInfo   = m_program->getShaderInfo(glu::SHADERTYPE_VERTEX);

			if (!fragmentShaderInfo.compileOk || !m_program->getProgramInfo().linkOk || dumpShaders)
			{
				errLog << "### dump of " << stageToName(FragmentShader) << "###\n";
				String msg((dumpShaders ? "Fragment shader should not have compiled" :
										  "Vertex shader compile failed while testing "));
				errLog << "Fragment shader compile failed while testing " << stageToName(getStage()) << ": "
					   << fragmentShaderInfo.infoLog << "\n";
				errLog << m_contextSupplier.getSource(FragmentShader);
			}
			if (!vertexShaderInfo.compileOk || !m_program->getProgramInfo().linkOk || dumpShaders)
			{
				errLog << "### dump of " << stageToName(VertexShader) << "###\n";
				String msg((dumpShaders ? "Vertex shader should not have compiled" :
										  "Vertex shader compile failed while testing "));
				errLog << msg << stageToName(getStage()) << ": " << vertexShaderInfo.infoLog << "\n";
				errLog << m_contextSupplier.getSource(VertexShader);
			}
		}
		else
		{
			const glu::ShaderInfo& computeShaderInfo = m_program->getShaderInfo(glu::SHADERTYPE_COMPUTE);

			if (!computeShaderInfo.compileOk || !m_program->getProgramInfo().linkOk || dumpShaders)
			{
				errLog << "### dump of " << stageToName(ComputeShader) << "###\n";
				String msg((dumpShaders ? "Compute shader should not have compiled" :
										  "Compute shader compile failed while testing "));
				errLog << msg << stageToName(ComputeShader) << ": " << computeShaderInfo.infoLog << "\n";
				errLog << m_contextSupplier.getSource(ComputeShader);
			}
		}
		if (!m_program->getProgramInfo().linkOk)
		{
			getStage();
			errLog << "Linking failed while testing " << stageToName(getStage()) << ": "
				   << m_program->getProgramInfo().infoLog << "\n";
			errLog << "### other stages ###\n";
			switch (getStage())
			{
			case FragmentShader:
				errLog << "### dump of " << stageToName(VertexShader) << "###\n";
				errLog << m_contextSupplier.getSource(VertexShader);
				break;
			case VertexShader:
				errLog << "### dump of " << stageToName(FragmentShader) << "###\n";
				errLog << stageToName(FragmentShader) << "\n";
				errLog << m_contextSupplier.getSource(FragmentShader);
				break;
			case ComputeShader:
				errLog << "### dump of " << stageToName(ComputeShader) << "###\n";
				errLog << stageToName(ComputeShader) << "\n";
				errLog << m_contextSupplier.getSource(ComputeShader);
				break;
			default:
				DE_ASSERT(0);
				break;
			}
		}
		return errLog.str();
	}